

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_owhere(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  char cVar2;
  OBJ_DATA *pOVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BUFFER *buffer;
  OBJ_DATA *pOVar7;
  char *pcVar8;
  char cVar9;
  char *__format;
  OBJ_DATA *obj;
  uint uVar10;
  char buf [4608];
  char *local_1248;
  char local_1238 [4616];
  
  buffer = new_buf();
  if (*argument == '\0') {
    send_to_char("Find what?\n\r",ch);
    return;
  }
  if (object_list != (OBJ_DATA *)0x0) {
    bVar6 = false;
    uVar10 = 0;
    obj = object_list;
    do {
      bVar5 = can_see_obj(ch,obj);
      bVar4 = bVar6;
      if (((bVar5) && (bVar6 = is_name(argument,obj->name), bVar6)) &&
         (pOVar3 = obj, obj->level <= ch->level)) {
        do {
          pOVar7 = pOVar3;
          pOVar3 = pOVar7->in_obj;
        } while (pOVar7->in_obj != (OBJ_DATA *)0x0);
        if (((pOVar7->carried_by == (CHAR_DATA *)0x0) ||
            (bVar6 = can_see(ch,pOVar7->carried_by), !bVar6)) ||
           (pOVar7->carried_by->in_room == (ROOM_INDEX_DATA *)0x0)) {
          if ((pOVar7->in_room == (ROOM_INDEX_DATA *)0x0) ||
             (bVar6 = can_see_room(ch,pOVar7->in_room), !bVar6)) goto LAB_00270ee6;
          local_1248 = obj->short_descr;
          pcVar8 = get_room_name(pOVar7->in_room);
          sVar1 = pOVar7->in_room->vnum;
          __format = "%3d) %s is in %s [Room %d]\n\r";
        }
        else {
          local_1248 = obj->short_descr;
          pcVar8 = pers(pOVar7->carried_by,ch);
          sVar1 = pOVar7->carried_by->in_room->vnum;
          __format = "%3d) %s is carried by %s [Room %d]\n\r";
        }
        sprintf(local_1238,__format,(ulong)(uVar10 + 1),local_1248,pcVar8,(ulong)(uint)(int)sVar1);
        cVar2 = (char)local_1238._0_4_;
        cVar9 = cVar2 + -0x20;
        if (0x19 < (byte)(cVar2 + 0x9fU)) {
          cVar9 = cVar2;
        }
        local_1238[0] = cVar9;
        add_buf(buffer,local_1238);
        bVar6 = true;
        bVar5 = 0xc6 < (int)uVar10;
        uVar10 = uVar10 + 1;
        bVar4 = true;
        if (bVar5) break;
      }
LAB_00270ee6:
      bVar6 = bVar4;
      obj = obj->next;
    } while (obj != (OBJ_DATA *)0x0);
    if (bVar6) {
      pcVar8 = buf_string(buffer);
      page_to_char(pcVar8,ch);
      goto LAB_00270f25;
    }
  }
  send_to_char("Nothing like that in heaven or earth.\n\r",ch);
LAB_00270f25:
  free_buf(buffer);
  return;
}

Assistant:

void do_owhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_INPUT_LENGTH];
	BUFFER *buffer;
	OBJ_DATA *obj;
	OBJ_DATA *in_obj;
	bool found;
	int number = 0, max_found;

	found = false;
	number = 0;
	max_found = 200;

	buffer = new_buf();

	if (argument[0] == '\0')
	{
		send_to_char("Find what?\n\r", ch);
		return;
	}

	for (obj = object_list; obj != nullptr; obj = obj->next)
	{
		if (!can_see_obj(ch, obj) || !is_name(argument, obj->name) || ch->level < obj->level)
			continue;

		number++;

		for (in_obj = obj; in_obj->in_obj != nullptr; in_obj = in_obj->in_obj)
			;

		if (in_obj->carried_by != nullptr && can_see(ch, in_obj->carried_by) && in_obj->carried_by->in_room != nullptr)
		{
			sprintf(buf, "%3d) %s is carried by %s [Room %d]\n\r",
				number, obj->short_descr,
				pers(in_obj->carried_by, ch),
				in_obj->carried_by->in_room->vnum);
		}
		else if (in_obj->in_room != nullptr && can_see_room(ch, in_obj->in_room))
		{
			sprintf(buf, "%3d) %s is in %s [Room %d]\n\r",
				number,
				obj->short_descr,
				get_room_name(in_obj->in_room),
				in_obj->in_room->vnum);
		}
		else
		{
			number--;
			continue;
		}

		found = true;

		buf[0] = UPPER(buf[0]);
		add_buf(buffer, buf);

		if (number >= max_found)
			break;
	}

	if (!found)
		send_to_char("Nothing like that in heaven or earth.\n\r", ch);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}